

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::PairwiseRankLoss::dim_forward
          (PairwiseRankLoss *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  invalid_argument *this_00;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  ostringstream s;
  Dim *in_stack_fffffffffffffdf8;
  Dim *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  ostream *in_stack_fffffffffffffe10;
  string local_1b8 [48];
  ostringstream local_188 [376];
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  local_10 = in_RDX;
  sVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar3 == 2) {
    std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
    std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
    bVar1 = cnn::operator!=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    if (!bVar1) {
      pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
      uVar2 = Dim::rows(pvVar4);
      if (uVar2 == 1) {
        pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
        uVar2 = Dim::ndims(pvVar4);
        if (uVar2 != 1) {
          pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
          uVar2 = Dim::ndims(pvVar4);
          if (uVar2 != 2) goto LAB_004a3653;
        }
        pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
        uVar2 = pvVar4->bd;
        pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
        if (uVar2 < pvVar4->bd) {
          pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
        }
        else {
          pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
        }
        memcpy(in_RDI,pvVar4,0x24);
        return in_RDI;
      }
    }
  }
LAB_004a3653:
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,"Bad input dimensions in PairwiseRankLoss: ");
  cnn::operator<<(in_stack_fffffffffffffe10,
                  (vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)
                  CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(this_00,local_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim PairwiseRankLoss::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 ||
      xs[0] != xs[1] ||
      xs[0].rows() != 1 ||
      (xs[0].ndims() != 1 && xs[0].ndims() != 2)) {
    ostringstream s; s << "Bad input dimensions in PairwiseRankLoss: " << xs;
    throw std::invalid_argument(s.str());
  }
  return xs[0].bd >= xs[1].bd ? xs[0] : xs[1];
}